

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

void __thiscall sf::RenderTarget::initialize(RenderTarget *this)

{
  uint uVar1;
  uint extraout_var;
  Uint64 UVar2;
  Rect<float> local_20;
  RenderTarget *local_10;
  RenderTarget *this_local;
  
  local_10 = this;
  uVar1 = (*this->_vptr_RenderTarget[2])();
  (*this->_vptr_RenderTarget[2])();
  Rect<float>::Rect(&local_20,0.0,0.0,(float)uVar1,(float)extraout_var);
  View::reset(&this->m_defaultView,&local_20);
  memcpy(&this->m_view,&this->m_defaultView,0xa6);
  (this->m_cache).glStatesSet = false;
  UVar2 = anon_unknown.dwarf_c483c::getUniqueId();
  this->m_id = UVar2;
  return;
}

Assistant:

void RenderTarget::initialize()
{
    // Setup the default and current views
    m_defaultView.reset(FloatRect(0, 0, static_cast<float>(getSize().x), static_cast<float>(getSize().y)));
    m_view = m_defaultView;

    // Set GL states only on first draw, so that we don't pollute user's states
    m_cache.glStatesSet = false;

    // Generate a unique ID for this RenderTarget to track
    // whether it is active within a specific context
    m_id = getUniqueId();
}